

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O2

void WriteSingleOutputFunctionBlif
               (DdManager *dd,DdNode *aFunc,char **pNames,int nNames,char *FileName)

{
  FILE *__stream;
  ulong uVar1;
  
  __stream = fopen(FileName,"w");
  fprintf(__stream,".model %s\n",FileName);
  fwrite(".inputs",7,1,__stream);
  if (nNames < 1) {
    nNames = 0;
  }
  for (uVar1 = 0; (uint)nNames != uVar1; uVar1 = uVar1 + 1) {
    fprintf(__stream," %s",pNames[uVar1]);
  }
  fputc(10,__stream);
  fwrite(".outputs F",10,1,__stream);
  fputc(10,__stream);
  WriteDDintoBLIFfile((FILE *)__stream,aFunc,"F","",pNames);
  fwrite(".end\n",5,1,__stream);
  fclose(__stream);
  return;
}

Assistant:

void WriteSingleOutputFunctionBlif( DdManager * dd, DdNode * aFunc, char ** pNames, int nNames, char * FileName )
{
    int i;
    FILE * pFile;

    // start the file
    pFile = fopen( FileName, "w" );
    fprintf( pFile, ".model %s\n", FileName );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nNames; i++ )
        fprintf( pFile, " %s", pNames[i] );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs F" );
    fprintf( pFile, "\n" );

    // write the DD into the file
    WriteDDintoBLIFfile( pFile, aFunc, "F", "", pNames );

    fprintf( pFile, ".end\n" );
    fclose( pFile );
}